

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageInput.cpp
# Opt level: O3

ImageInput * __thiscall ImageInput::readImage(ImageInput *this,string *imagePath)

{
  pointer pcVar1;
  char cVar2;
  runtime_error *this_00;
  long *in_RDX;
  long *local_48 [2];
  long local_38 [2];
  
  pcVar1 = imagePath[3]._M_dataplus._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>((string *)local_48,*in_RDX,in_RDX[1] + *in_RDX);
  (*(code *)**(undefined8 **)pcVar1)(this,pcVar1,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  cVar2 = cv::Mat::empty();
  if (cVar2 == '\0') {
    return this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Invalid File Path");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

cv::Mat ImageInput::readImage(std::string imagePath) {
  // get mat format of image from image reader
  cv::Mat cvImage = getReader()->read(imagePath);
  // check validity of image
  if (cvImage.empty()) {
    throw std::runtime_error("Invalid File Path");
  }
  return cvImage;
}